

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O2

void __thiscall QTextTable::removeRows(QTextTable *this,int pos,int num)

{
  QTextTablePrivate *this_00;
  QTextDocumentPrivate *this_01;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  reference pvVar6;
  qsizetype qVar7;
  long lVar8;
  uint *puVar9;
  int c;
  int iVar10;
  long in_FS_OFFSET;
  int cell;
  undefined1 local_78 [16];
  QArrayDataPointer<int> local_68;
  ConstIterator local_48;
  QExplicitlySharedDataPointer<QFontPrivate> local_38;
  
  local_38.d.ptr = *(totally_ordered_wrapper<QFontPrivate_*> *)(in_FS_OFFSET + 0x28);
  if (-1 < pos && 0 < num) {
    this_00 = *(QTextTablePrivate **)&(this->super_QTextFrame).super_QTextObject.field_0x8;
    if (this_00->dirty == true) {
      QTextTablePrivate::update(this_00);
    }
    uVar5 = this_00->nRows;
    if (uVar5 - pos != 0 && pos <= (int)uVar5) {
      iVar4 = uVar5 - pos;
      if ((uint)(num + pos) <= uVar5) {
        iVar4 = num;
      }
      this_01 = (this_00->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
      QTextDocumentPrivate::beginEditBlock(this_01);
      if ((pos == 0) && (iVar4 == this_00->nRows)) {
        uVar2 = QFragmentMapData<QTextFragmentData>::position
                          (&(this_01->fragments).data,
                           *(uint *)&(this_00->super_QTextFramePrivate).super_QTextObjectPrivate.
                                     field_0x84,0);
        QFragmentMapData<QTextFragmentData>::position
                  (&(this_01->fragments).data,(this_00->super_QTextFramePrivate).fragment_end,0);
        QTextDocumentPrivate::remove(this_01,(char *)(ulong)uVar2);
        if ((totally_ordered_wrapper<QFontPrivate_*>)*(QFontPrivate **)(in_FS_OFFSET + 0x28) ==
            local_38.d.ptr) {
          QTextDocumentPrivate::endEditBlock(this_01);
          return;
        }
        goto LAB_004af6a4;
      }
      cellAt((QTextTable *)&local_68,(int)this,pos);
      iVar3 = QTextTableCell::firstPosition((QTextTableCell *)&local_68);
      iVar10 = iVar4 + pos;
      cellAt((QTextTable *)&local_48,(int)this,iVar4 + pos + -1);
      iVar4 = QTextTableCell::lastPosition((QTextTableCell *)&local_48);
      QTextDocumentPrivate::aboutToRemoveCell(this_01,iVar3,iVar4);
      local_68.d = (Data *)0x0;
      local_68.ptr = (int *)0x0;
      local_68.size = 0;
      for (; pos < iVar10; pos = pos + 1) {
        iVar4 = 0;
        while( true ) {
          if (this_00->nCols <= iVar4) break;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this_00->grid,(long)(this_00->nCols * pos + iVar4));
          cell = *pvVar6;
          bVar1 = QListSpecialMethodsBase<int>::contains<int>
                            ((QListSpecialMethodsBase<int> *)&local_68,&cell);
          if (!bVar1) {
            QList<int>::append((QList<int> *)&local_68,cell);
            local_48._12_4_ = 0xaaaaaaaa;
            local_48.n = cell;
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_48.pt = &this_01->fragments;
            QTextFormatCollection::charFormat((QTextFormatCollection *)local_78,(int)this_01 + 0xe8)
            ;
            iVar3 = QTextCharFormat::tableCellRowSpan((QTextCharFormat *)local_78);
            if (iVar3 < 2) {
              qVar7 = QtPrivate::indexOf<int,int>(&this_00->cells,&cell,0);
              lVar8 = (long)((int)qVar7 + 1);
              puVar9 = &(this_00->super_QTextFramePrivate).fragment_end;
              if (lVar8 < (this_00->cells).d.size) {
                puVar9 = (uint *)((this_00->cells).d.ptr + lVar8);
              }
              uVar2 = *puVar9;
              uVar5 = QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_48);
              QFragmentMapData<QTextFragmentData>::position(&(this_01->fragments).data,uVar2,0);
              QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_48);
              QTextDocumentPrivate::remove(this_01,(char *)(ulong)uVar5);
            }
            else {
              QTextCharFormat::setTableCellRowSpan((QTextCharFormat *)local_78,iVar3 + -1);
              iVar3 = QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_48);
              QTextDocumentPrivate::setCharFormat
                        (this_01,iVar3,1,(QTextCharFormat *)local_78,SetFormat);
            }
            QTextFormat::~QTextFormat((QTextFormat *)local_78);
          }
          iVar4 = iVar4 + 1;
        }
      }
      QTextDocumentPrivate::endEditBlock(this_01);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_68);
    }
  }
  if ((totally_ordered_wrapper<QFontPrivate_*>)*(QFontPrivate **)(in_FS_OFFSET + 0x28) ==
      local_38.d.ptr) {
    return;
  }
LAB_004af6a4:
  __stack_chk_fail();
}

Assistant:

void QTextTable::removeRows(int pos, int num)
{
    Q_D(QTextTable);
//     qDebug() << "-------- removeRows" << pos << num;

    if (num <= 0 || pos < 0)
        return;
    if (d->dirty)
        d->update();
    if (pos >= d->nRows)
        return;
    if (pos+num > d->nRows)
        num = d->nRows - pos;

    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *collection = p->formatCollection();
    p->beginEditBlock();

    // delete whole table?
    if (pos == 0 && num == d->nRows) {
        const int pos = p->fragmentMap().position(d->fragment_start);
        p->remove(pos, p->fragmentMap().position(d->fragment_end) - pos + 1);
        p->endEditBlock();
        return;
    }

    p->aboutToRemoveCell(cellAt(pos, 0).firstPosition(), cellAt(pos + num - 1, d->nCols - 1).lastPosition());

    QList<int> touchedCells;
    for (int r = pos; r < pos + num; ++r) {
        for (int c = 0; c < d->nCols; ++c) {
            int cell = d->grid[r*d->nCols + c];
            if (touchedCells.contains(cell))
                continue;
            touchedCells << cell;
            QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
            QTextCharFormat fmt = collection->charFormat(it->format);
            int span = fmt.tableCellRowSpan();
            if (span > 1) {
                fmt.setTableCellRowSpan(span - 1);
                p->setCharFormat(it.position(), 1, fmt);
            } else {
                // remove cell
                int index = d->cells.indexOf(cell) + 1;
                int f_end = index < d->cells.size() ? d->cells.at(index) : d->fragment_end;
                p->remove(it.position(), p->fragmentMap().position(f_end) - it.position());
            }
        }
    }

    p->endEditBlock();
//     qDebug() << "-------- end removeRows" << pos << num;
}